

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

bool hashstring(char *str,char *result,int maxlen)

{
  byte bVar1;
  int i;
  size_t sVar2;
  long lVar3;
  hashval hv;
  hashval local_30;
  
  if (0x30 < maxlen) {
    sVar2 = strlen(str);
    tiger::hash((uchar *)str,(int)sVar2,&local_30);
    lVar3 = 0;
    do {
      bVar1 = local_30.bytes[lVar3];
      result[lVar3 * 2] = "0123456789abcdef"[bVar1 & 0xf];
      result[lVar3 * 2 + 1] = "0123456789abcdef"[bVar1 >> 4];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x18);
    result[0x30] = '\0';
  }
  return 0x30 < maxlen;
}

Assistant:

bool hashstring(const char *str, char *result, int maxlen)
{
    tiger::hashval hv;
    if(maxlen < 2*(int)sizeof(hv.bytes) + 1) return false;
    tiger::hash((uchar *)str, strlen(str), hv);
    loopi(sizeof(hv.bytes))
    {
        uchar c = hv.bytes[i];
        *result++ = "0123456789abcdef"[c&0xF];
        *result++ = "0123456789abcdef"[c>>4];
    }
    *result = '\0';
    return true;
}